

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
i2p::sam::Session::StreamAccept(Session *this)

{
  Sock *sock;
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *request;
  Session *in_RSI;
  long in_FS_OFFSET;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  Reply local_a0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Hello(this);
  sock = (Sock *)(this->m_private_key_file).super_path._M_pathname._M_dataplus._M_p;
  tinyformat::format<std::__cxx11::string>
            (&local_c0,(tinyformat *)"STREAM ACCEPT ID=%s SILENT=false",
             (char *)&in_RSI->m_session_id,in_RCX);
  request = &local_c0;
  SendRequestAndGetReply(&local_a0,in_RSI,sock,request,false);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"RESULT",&local_e1);
  Reply::Get(&local_c0,&local_a0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = std::operator==(&local_c0,"OK");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_c0);
    Reply::~Reply(&local_a0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
    }
  }
  else {
    bVar1 = std::operator==(&local_c0,"INVALID_ID");
    if (bVar1) {
      Disconnect(in_RSI);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_e0,(tinyformat *)0xca43de,(char *)&local_a0,request);
    std::runtime_error::runtime_error(this_00,(string *)&local_e0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Session::StreamAccept()
{
    auto sock = Hello();

    const Reply& reply = SendRequestAndGetReply(
        *sock, strprintf("STREAM ACCEPT ID=%s SILENT=false", m_session_id), false);

    const std::string& result = reply.Get("RESULT");

    if (result == "OK") {
        return sock;
    }

    if (result == "INVALID_ID") {
        // If our session id is invalid, then force session re-creation on next usage.
        Disconnect();
    }

    throw std::runtime_error(strprintf("\"%s\"", reply.full));
}